

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  uint uVar1;
  
  uVar1 = 0;
  if (tostore != -1) {
    uVar1 = tostore << 0x10;
  }
  uVar1 = nelems << 0x18 | base << 7 | uVar1;
  if (nelems < 0x100) {
    uVar1 = uVar1 | 0x4e;
  }
  else {
    luaK_code(fs,uVar1 | 0x804e);
    uVar1 = (uint)nelems >> 1 & 0x3fffff80 | 0x52;
  }
  luaK_code(fs,uVar1);
  fs->freereg = (char)base + '\x01';
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  lua_assert(tostore != 0 && tostore <= LFIELDS_PER_FLUSH);
  if (tostore == LUA_MULTRET)
    tostore = 0;
  if (nelems <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, tostore, nelems);
  else {
    int extra = nelems / (MAXARG_C + 1);
    nelems %= (MAXARG_C + 1);
    luaK_codeABCk(fs, OP_SETLIST, base, tostore, nelems, 1);
    codeextraarg(fs, extra);
  }
  fs->freereg = base + 1;  /* free registers with list values */
}